

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

int main(void)

{
  long lVar1;
  GlobalFunctionTest *in_RDI;
  ViewTest *pVVar2;
  MarrayTest *this;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar7;
  long lVar6;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar11;
  long lVar16;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ViewTest t;
  int aiStack_2bc [19];
  undefined8 uStack_270;
  ViewTest local_25c;
  
  uStack_270 = 0x143147;
  GlobalFunctionTest::shapeStrideTest(in_RDI);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x1431b6;
  ViewTest::coordinatesToOffsetTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143223;
  ViewTest::coordinatesToOffsetTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143290;
  ViewTest::coordinatesToIndexTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x1432fd;
  ViewTest::coordinatesToIndexTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x14336a;
  ViewTest::indexToCoordinatesTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x1433d7;
  ViewTest::indexToCoordinatesTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143444;
  ViewTest::indexToOffsetTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x1434b1;
  ViewTest::indexToOffsetTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x14351e;
  ViewTest::emptyConstructorTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x14358b;
  ViewTest::emptyConstructorTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x1435f8;
  ViewTest::scalarConstructorTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143665;
  ViewTest::scalarConstructorTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x1436d2;
  ViewTest::shapeConstructorTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x14373f;
  ViewTest::shapeConstructorTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x1437ac;
  ViewTest::shapeAssignTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143819;
  ViewTest::shapeAssignTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143886;
  ViewTest::shapeStrideConstructorTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x1438f3;
  ViewTest::shapeStrideConstructorTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143960;
  ViewTest::shapeStrideAssignTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x1439cd;
  ViewTest::shapeStrideAssignTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143a3a;
  ViewTest::copyConstructorTest(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143aa7;
  ViewTest::assignmentOperatorTest<(andres::CoordinateOrder)1>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143b14;
  ViewTest::assignmentOperatorTest<(andres::CoordinateOrder)0>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143b81;
  ViewTest::queryTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143bee;
  ViewTest::queryTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143c5b;
  ViewTest::elementAccessTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143cc8;
  ViewTest::elementAccessTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143d35;
  ViewTest::subViewsTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143da2;
  ViewTest::subViewsTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143e0f;
  ViewTest::subConstViewsTest(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143e7c;
  ViewTest::iteratorAccessTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143ee9;
  ViewTest::iteratorAccessTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143f56;
  ViewTest::coordinateBindingTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x143fc3;
  ViewTest::coordinateBindingTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x144030;
  ViewTest::transposeTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x14409d;
  ViewTest::transposeTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x14410a;
  ViewTest::permuteTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x144177;
  ViewTest::permuteTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x1441e4;
  ViewTest::shiftOperatorTest<false,(andres::CoordinateOrder)1>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x144251;
  ViewTest::shiftOperatorTest<false,(andres::CoordinateOrder)0>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x1442be;
  ViewTest::shiftOperatorTest<true,(andres::CoordinateOrder)1>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x14432b;
  ViewTest::shiftOperatorTest<true,(andres::CoordinateOrder)0>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x144398;
  ViewTest::arithmeticOperatorsTest(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x144405;
  ViewTest::asStringTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  pVVar2 = &local_25c;
  uStack_270 = 0x14446f;
  ViewTest::asStringTest<false>(pVVar2);
  lVar1 = 100;
  do {
    lVar1 = lVar1 + -4;
  } while (lVar1 != 0);
  uStack_270 = 0x14447f;
  ViewTest::reshapeTest(pVVar2);
  lVar1 = 100;
  do {
    lVar1 = lVar1 + -4;
  } while (lVar1 != 0);
  uStack_270 = 0x14448f;
  ViewTest::overlapTreatmentTest(pVVar2);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    lVar1 = lVar1 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x1444c7;
  IteratorTest::constructorTest<false>((IteratorTest *)&local_25c);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    lVar1 = lVar1 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x1444ff;
  IteratorTest::constructorTest<true>((IteratorTest *)&local_25c);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    lVar1 = lVar1 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x144537;
  IteratorTest::accessIteratorOperations<false>((IteratorTest *)&local_25c);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    lVar1 = lVar1 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x14456f;
  IteratorTest::accessIteratorOperations<true>((IteratorTest *)&local_25c);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    lVar1 = lVar1 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x1445a7;
  IteratorTest::arithmeticOperatorsTest<false>((IteratorTest *)&local_25c);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    lVar1 = lVar1 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x1445df;
  IteratorTest::arithmeticOperatorsTest<true>((IteratorTest *)&local_25c);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    lVar1 = lVar1 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x144617;
  IteratorTest::comparisonOperators<false>((IteratorTest *)&local_25c);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    lVar1 = lVar1 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x14464f;
  IteratorTest::comparisonOperators<true>((IteratorTest *)&local_25c);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    lVar1 = lVar1 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x144687;
  IteratorTest::hasMoreTest<false>((IteratorTest *)&local_25c);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    lVar1 = lVar1 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x1446bf;
  IteratorTest::hasMoreTest<true>((IteratorTest *)&local_25c);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    lVar1 = lVar1 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x1446f7;
  IteratorTest::indexTest<false>((IteratorTest *)&local_25c);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    lVar1 = lVar1 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x14472f;
  IteratorTest::indexTest<true>((IteratorTest *)&local_25c);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    lVar1 = lVar1 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x144767;
  IteratorTest::coordinateTest<false>((IteratorTest *)&local_25c);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    lVar1 = lVar1 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x1447a2;
  IteratorTest::coordinateTest<true>((IteratorTest *)&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  this = (MarrayTest *)&local_25c;
  uStack_270 = 0x14480c;
  MarrayTest::constructorTest(this);
  lVar1 = 100;
  do {
    lVar1 = lVar1 + -4;
  } while (lVar1 != 0);
  uStack_270 = 0x14481c;
  MarrayTest::assignTest(this);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x14488b;
  MarrayTest::copyConstructorTest<false>((MarrayTest *)&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x1448f8;
  MarrayTest::copyConstructorTest<true>((MarrayTest *)&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x144965;
  MarrayTest::assignmentOperatorTest<false>((MarrayTest *)&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x1449d2;
  MarrayTest::assignmentOperatorTest<true>((MarrayTest *)&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x144a3f;
  MarrayTest::reshapeTest((MarrayTest *)&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x144aac;
  MarrayTest::resizeTest<(andres::CoordinateOrder)1>((MarrayTest *)&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x19;
  do {
    aiStack_2bc[lVar1] = iVar3;
    aiStack_2bc[lVar1 + 1] = iVar4;
    aiStack_2bc[lVar1 + 2] = iVar5;
    aiStack_2bc[lVar1 + 3] = iVar7;
    local_25c.data_[lVar1 + -1] = iVar3 * 2;
    local_25c.data_[lVar1] = iVar4 * 2;
    local_25c.data_[lVar1 + 1] = iVar5 * 2;
    local_25c.data_[lVar1 + 2] = iVar7 * 2;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x31);
  iVar3 = 0;
  iVar4 = 1;
  iVar5 = 2;
  iVar7 = 3;
  lVar1 = 0x31;
  do {
    local_25c.data_[lVar1 + -1] = iVar3;
    local_25c.data_[lVar1] = iVar4;
    local_25c.data_[lVar1 + 1] = iVar5;
    local_25c.data_[lVar1 + 2] = iVar7;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x95);
  uStack_270 = 0x144b16;
  MarrayTest::resizeTest<(andres::CoordinateOrder)0>((MarrayTest *)&local_25c);
  iVar3 = 2;
  iVar4 = 3;
  iVar5 = 0;
  iVar7 = 1;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar5 + 1;
    local_25c.data_[lVar1] = iVar7 + 1;
    local_25c.data_[lVar1 + 1] = iVar3 + 1;
    local_25c.data_[lVar1 + 2] = iVar4 + 1;
    lVar1 = lVar1 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x144b5f;
  ExpressionTemplateTest::constructionAndAssignmentTest((ExpressionTemplateTest *)&local_25c);
  iVar3 = 2;
  iVar4 = 3;
  iVar5 = 0;
  iVar7 = 1;
  lVar1 = 0;
  do {
    local_25c.data_[lVar1 + -1] = iVar5 + 1;
    local_25c.data_[lVar1] = iVar7 + 1;
    local_25c.data_[lVar1 + 1] = iVar3 + 1;
    local_25c.data_[lVar1 + 2] = iVar4 + 1;
    lVar1 = lVar1 + 4;
    iVar5 = iVar5 + 4;
    iVar7 = iVar7 + 4;
    iVar3 = iVar3 + 4;
    iVar4 = iVar4 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x144ba8;
  ExpressionTemplateTest::arithmeticOperatorsTest((ExpressionTemplateTest *)&local_25c);
  iVar3 = 2;
  lVar6 = 3;
  iVar4 = 0;
  lVar8 = 1;
  lVar1 = 0;
  auVar14._8_4_ = 0xffffffff;
  auVar14._0_8_ = 0xffffffffffffffff;
  auVar14._12_4_ = 0xffffffff;
  do {
    lVar11 = lVar8 - auVar14._8_8_;
    lVar16 = lVar6 - auVar14._8_8_;
    auVar12._0_4_ = (int)(short)(iVar4 + 1);
    auVar12._4_4_ = (int)(short)lVar11;
    auVar12._8_4_ = (int)(short)(iVar3 + 1);
    auVar12._12_4_ = (int)(short)lVar16;
    auVar12 = packssdw(auVar12,auVar12);
    *(long *)((long)local_25c.data2x_ + lVar1 * 2 + -4) = auVar12._0_8_;
    local_25c.data_[lVar1 + -1] = iVar4 + 1;
    local_25c.data_[lVar1] = (int)lVar11;
    local_25c.data_[lVar1 + 1] = iVar3 + 1;
    local_25c.data_[lVar1 + 2] = (int)lVar16;
    lVar1 = lVar1 + 4;
    iVar4 = iVar4 + 4;
    lVar8 = lVar8 + 4;
    iVar3 = iVar3 + 4;
    lVar6 = lVar6 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x144c12;
  DifferingTypesTest::constructionTest((DifferingTypesTest *)&local_25c);
  iVar3 = 2;
  lVar6 = 3;
  iVar4 = 0;
  lVar8 = 1;
  lVar1 = 0;
  auVar9._8_4_ = 0xffffffff;
  auVar9._0_8_ = 0xffffffffffffffff;
  auVar9._12_4_ = 0xffffffff;
  do {
    lVar11 = lVar8 - auVar9._8_8_;
    lVar16 = lVar6 - auVar9._8_8_;
    auVar13._0_4_ = (int)(short)(iVar4 + 1);
    auVar13._4_4_ = (int)(short)lVar11;
    auVar13._8_4_ = (int)(short)(iVar3 + 1);
    auVar13._12_4_ = (int)(short)lVar16;
    auVar14 = packssdw(auVar13,auVar13);
    *(long *)((long)local_25c.data2x_ + lVar1 * 2 + -4) = auVar14._0_8_;
    local_25c.data_[lVar1 + -1] = iVar4 + 1;
    local_25c.data_[lVar1] = (int)lVar11;
    local_25c.data_[lVar1 + 1] = iVar3 + 1;
    local_25c.data_[lVar1 + 2] = (int)lVar16;
    lVar1 = lVar1 + 4;
    iVar4 = iVar4 + 4;
    lVar8 = lVar8 + 4;
    iVar3 = iVar3 + 4;
    lVar6 = lVar6 + 4;
  } while (lVar1 != 0x18);
  uStack_270 = 0x144c7c;
  DifferingTypesTest::assignmentTest((DifferingTypesTest *)&local_25c);
  iVar3 = 2;
  lVar6 = 3;
  iVar4 = 0;
  lVar8 = 1;
  lVar1 = 0;
  auVar10._8_4_ = 0xffffffff;
  auVar10._0_8_ = 0xffffffffffffffff;
  auVar10._12_4_ = 0xffffffff;
  do {
    lVar11 = lVar8 - auVar10._8_8_;
    lVar16 = lVar6 - auVar10._8_8_;
    auVar15._0_4_ = (int)(short)(iVar4 + 1);
    auVar15._4_4_ = (int)(short)lVar11;
    auVar15._8_4_ = (int)(short)(iVar3 + 1);
    auVar15._12_4_ = (int)(short)lVar16;
    auVar14 = packssdw(auVar15,auVar15);
    *(long *)((long)local_25c.data2x_ + lVar1 * 2 + -4) = auVar14._0_8_;
    local_25c.data_[lVar1 + -1] = iVar4 + 1;
    local_25c.data_[lVar1] = (int)lVar11;
    local_25c.data_[lVar1 + 1] = iVar3 + 1;
    local_25c.data_[lVar1 + 2] = (int)lVar16;
    lVar1 = lVar1 + 4;
    iVar4 = iVar4 + 4;
    lVar8 = lVar8 + 4;
    iVar3 = iVar3 + 4;
    lVar6 = lVar6 + 4;
  } while (lVar1 != 0x18);
  pVVar2 = &local_25c;
  uStack_270 = 0x144ce6;
  DifferingTypesTest::arithmeticOperatorsTest((DifferingTypesTest *)pVVar2);
  uStack_270 = 0x144ceb;
  DifferingTypesTest::nonBasicTypesTest((DifferingTypesTest *)pVVar2);
  uStack_270 = 0x144cf0;
  DifferingTypesTest::typePromotionTest((DifferingTypesTest *)pVVar2);
  uStack_270 = 0x144d0b;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"All tests have been passed.",0x1b);
  uStack_270 = 0x144d1f;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  uStack_270 = 0x144d2a;
  std::ostream::put('\0');
  uStack_270 = 0x144d32;
  std::ostream::flush();
  return 0;
}

Assistant:

int main() 
{
    { GlobalFunctionTest t; t.shapeStrideTest(); }

    { ViewTest t; t.coordinatesToOffsetTest<false>(); }
    { ViewTest t; t.coordinatesToOffsetTest<true>(); }
    { ViewTest t; t.coordinatesToIndexTest<false>(); }
    { ViewTest t; t.coordinatesToIndexTest<true>(); }
    { ViewTest t; t.indexToCoordinatesTest<false>(); }
    { ViewTest t; t.indexToCoordinatesTest<true>(); }
    { ViewTest t; t.indexToOffsetTest<false>(); }
    { ViewTest t; t.indexToOffsetTest<true>(); }
    { ViewTest t; t.emptyConstructorTest<false>(); }
    { ViewTest t; t.emptyConstructorTest<true>(); }
    { ViewTest t; t.scalarConstructorTest<false>(); }
    { ViewTest t; t.scalarConstructorTest<true>(); }
    { ViewTest t; t.shapeConstructorTest<false>(); }
    { ViewTest t; t.shapeConstructorTest<true>(); }
    { ViewTest t; t.shapeAssignTest<false>(); }
    { ViewTest t; t.shapeAssignTest<true>(); }
    { ViewTest t; t.shapeStrideConstructorTest<false>(); }
    { ViewTest t; t.shapeStrideConstructorTest<true>(); } 
    { ViewTest t; t.shapeStrideAssignTest<false>(); }
    { ViewTest t; t.shapeStrideAssignTest<true>(); }
    { ViewTest t; t.copyConstructorTest(); } 
    { ViewTest t; t.assignmentOperatorTest<andres::LastMajorOrder>(); } 
    { ViewTest t; t.assignmentOperatorTest<andres::FirstMajorOrder>(); }
    { ViewTest t; t.queryTest<false>(); }
    { ViewTest t; t.queryTest<true>(); }
    { ViewTest t; t.elementAccessTest<false>(); }
    { ViewTest t; t.elementAccessTest<true>(); }
    { ViewTest t; t.subViewsTest<false>(); }
    { ViewTest t; t.subViewsTest<true>(); }
    { ViewTest t; t.subConstViewsTest(); }
    { ViewTest t; t.iteratorAccessTest<false>(); }
    { ViewTest t; t.iteratorAccessTest<true>(); } 
    { ViewTest t; t.coordinateBindingTest<false>(); }
    { ViewTest t; t.coordinateBindingTest<true>(); }
    { ViewTest t; t.transposeTest<false>(); }
    { ViewTest t; t.transposeTest<true>(); }
    { ViewTest t; t.permuteTest<false>(); }
    { ViewTest t; t.permuteTest<true>(); } 
    { ViewTest t; t.shiftOperatorTest<false, andres::LastMajorOrder>(); }
    { ViewTest t; t.shiftOperatorTest<false, andres::FirstMajorOrder>(); }
    { ViewTest t; t.shiftOperatorTest<true, andres::LastMajorOrder>(); }
    { ViewTest t; t.shiftOperatorTest<true, andres::FirstMajorOrder>(); } 
    { ViewTest t; t.arithmeticOperatorsTest(); }
    { ViewTest t; t.asStringTest<true>(); } 
    { ViewTest t; t.asStringTest<false>(); } 
    { ViewTest t; t.reshapeTest(); }
    { ViewTest t; t.overlapTreatmentTest(); }
    { ViewTest t; t.compatibilityFunctionsTest(); }

    { IteratorTest t; t.constructorTest<false>(); }
    { IteratorTest t; t.constructorTest<true>(); }
    { IteratorTest t; t.accessIteratorOperations<false>(); }
    { IteratorTest t; t.accessIteratorOperations<true>(); }
    { IteratorTest t; t.arithmeticOperatorsTest<false>(); }
    { IteratorTest t; t.arithmeticOperatorsTest<true>(); }
    { IteratorTest t; t.comparisonOperators<false>(); }
    { IteratorTest t; t.comparisonOperators<true>(); }
    { IteratorTest t; t.hasMoreTest<false>(); }
    { IteratorTest t; t.hasMoreTest<true>(); }
    { IteratorTest t; t.indexTest<false>(); }
    { IteratorTest t; t.indexTest<true>(); }
    { IteratorTest t; t.coordinateTest<false>(); }
    { IteratorTest t; t.coordinateTest<true>(); }

    { MarrayTest t; t.constructorTest(); } 
    { MarrayTest t; t.assignTest(); } 
    { MarrayTest t; t.copyConstructorTest<false>(); }
    { MarrayTest t; t.copyConstructorTest<true>(); }
    { MarrayTest t; t.assignmentOperatorTest<false>(); }
    { MarrayTest t; t.assignmentOperatorTest<true>(); }
    { MarrayTest t; t.reshapeTest(); } 
    { MarrayTest t; t.resizeTest<andres::LastMajorOrder>(); } 
    { MarrayTest t; t.resizeTest<andres::FirstMajorOrder>(); } 

    { ExpressionTemplateTest t; t.constructionAndAssignmentTest(); }
    { ExpressionTemplateTest t; t.arithmeticOperatorsTest(); }

    { DifferingTypesTest t; t.constructionTest(); }
    { DifferingTypesTest t; t.assignmentTest(); }
    { DifferingTypesTest t; t.arithmeticOperatorsTest(); }
    { DifferingTypesTest t; t.nonBasicTypesTest(); }
    { DifferingTypesTest t; t.typePromotionTest(); }

    #ifdef HAVE_CPP0X_INITIALIZER_LISTS
    { Cpp0xTest t; t.test(); }
    #endif

    std::cout << "All tests have been passed." << std::endl;
    return 0;
}